

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

Gia_Man_t * Dam_ManMultiAig(Dam_Man_t *pMan)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *p;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  uint *puVar8;
  Vec_Int_t *pVVar9;
  int *__s;
  Gia_Obj_t *pGVar10;
  Gia_Man_t *pGVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  
  pGVar11 = pMan->pGia;
  p_00 = Gia_ManStart(pGVar11->nObjs * 2);
  pcVar1 = pGVar11->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pName = pcVar7;
  pcVar1 = pGVar11->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pSpec = pcVar7;
  iVar4 = p_00->nObjsAlloc;
  puVar8 = (uint *)calloc((long)iVar4,4);
  p_00->pMuxes = puVar8;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar15 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar15 = iVar4;
  }
  pVVar9->nCap = iVar15;
  if (iVar15 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar15 << 2);
  }
  pVVar9->pArray = __s;
  pVVar9->nSize = iVar4;
  memset(__s,0,(long)iVar4 << 2);
  p_00->vLevels = pVVar9;
  Gia_ManFillValue(pGVar11);
  pGVar11->pObjs->Value = 0;
  pVVar9 = pGVar11->vCis;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      iVar4 = pVVar9->pArray[lVar12];
      if (((long)iVar4 < 0) || (pGVar11->nObjs <= iVar4)) goto LAB_00657b5e;
      pGVar2 = pGVar11->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar14 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar14 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar14 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar10 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar10)) {
LAB_00657b3f:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar10 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar10)) goto LAB_00657b3f;
      pGVar2 = pGVar2 + iVar4;
      uVar14 = ((long)pGVar10 - (long)pGVar3 >> 2) * -0x5555555555555555;
      uVar13 = (uint)uVar14;
      uVar5 = uVar13 * 2;
      pGVar2->Value = uVar5;
      if ((int)uVar5 < 0) goto LAB_00657b9c;
      pGVar3 = pGVar11->pObjs;
      if ((pGVar2 < pGVar3) || (pGVar3 + pGVar11->nObjs <= pGVar2)) goto LAB_00657b3f;
      pVVar9 = p_00->vLevels;
      uVar16 = ((long)pGVar2 - (long)pGVar3 >> 2) * -0x5555555555555555;
      p = pGVar11->vLevels;
      iVar4 = (int)uVar16;
      Vec_IntFillExtra(p,iVar4 + 1,0);
      if ((iVar4 < 0) || (p->nSize <= iVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (pVVar9->nSize <= (int)(uVar13 & 0x7fffffff)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar9->pArray[uVar14 & 0x7fffffff] = p->pArray[uVar16 & 0x7fffffff];
      lVar12 = lVar12 + 1;
      pVVar9 = pGVar11->vCis;
    } while (lVar12 < pVVar9->nSize);
  }
  Gia_ManHashStart(p_00);
  iVar4 = pGVar11->nObjs;
  if (0 < iVar4 && pGVar11->nBufs != 0) {
    iVar15 = 0;
    lVar12 = 0;
    do {
      pGVar2 = pGVar11->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar5 = (uint)*(undefined8 *)(&pGVar2->field_0x0 + lVar12);
      if (((-1 < (int)uVar5) && ((uVar5 & 0x1fffffff) != 0x1fffffff)) &&
         ((uVar5 & 0x1fffffff) ==
          ((uint)((ulong)*(undefined8 *)(&pGVar2->field_0x0 + lVar12) >> 0x20) & 0x1fffffff))) {
        Dam_ManMultiAig_rec(pMan,p_00,pGVar11,
                            (Gia_Obj_t *)
                            ((long)pGVar2 + (ulong)((uVar5 & 0x1fffffff) << 2) * -3 + lVar12));
        uVar13 = (uint)*(undefined8 *)(&pGVar2->field_0x0 + lVar12);
        uVar5 = *(uint *)((long)pGVar2 + (ulong)((uVar13 & 0x1fffffff) << 2) * -3 + lVar12 + 8);
        if ((int)uVar5 < 0) goto LAB_00657bbb;
        uVar5 = Gia_ManAppendBuf(p_00,uVar13 >> 0x1d & 1 ^ uVar5);
        *(uint *)((long)&pGVar2->Value + lVar12) = uVar5;
        if ((int)uVar5 < 0) {
LAB_00657b9c:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        if (p_00->nObjs <= (int)(uVar5 >> 1)) goto LAB_00657b5e;
        Gia_ObjSetGateLevel(p_00,p_00->pObjs + (uVar5 >> 1));
        iVar4 = pGVar11->nObjs;
      }
      lVar12 = lVar12 + 0xc;
      iVar15 = iVar15 + 1;
    } while (iVar15 < iVar4);
  }
  pVVar9 = pGVar11->vCos;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      iVar4 = pVVar9->pArray[lVar12];
      if (((long)iVar4 < 0) || (pGVar11->nObjs <= iVar4)) {
LAB_00657b5e:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar11->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = pGVar11->pObjs + iVar4;
      Dam_ManMultiAig_rec(pMan,p_00,pGVar11,pGVar2 + -(*(ulong *)pGVar2 & 0x1fffffff));
      if ((int)pGVar2[-(*(ulong *)pGVar2 & 0x1fffffff)].Value < 0) {
LAB_00657bbb:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      uVar5 = Gia_ManAppendCo(p_00,(uint)(*(ulong *)pGVar2 >> 0x1d) & 1 ^
                                   pGVar2[-(*(ulong *)pGVar2 & 0x1fffffff)].Value);
      pGVar2->Value = uVar5;
      lVar12 = lVar12 + 1;
      pVVar9 = pGVar11->vCos;
    } while (lVar12 < pVVar9->nSize);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,pGVar11->nRegs);
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar11;
}

Assistant:

Gia_Man_t * Dam_ManMultiAig( Dam_Man_t * pMan )
{
    Gia_Man_t * p = pMan->pGia;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    // start the new manager
    pNew = Gia_ManStart( 2*Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    pNew->vLevels = Vec_IntStart( pNew->nObjsAlloc );
    // create constant and inputs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Gia_ManAppendCi( pNew );
        Vec_IntWriteEntry( pNew->vLevels, Abc_Lit2Var(pObj->Value), Gia_ObjLevel(p, pObj) );
    }
    // create internal nodes
    Gia_ManHashStart( pNew );
    Gia_ManForEachBuf( p, pObj, i )
    {
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin0(pObj) );
        pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value)) );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin0(pObj) );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
//    assert( Gia_ManObjNum(pNew) <= Gia_ManObjNum(p) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}